

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall
Js::DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo
          (DeferDeserializeFunctionInfo *this,int nestedCount,LocalFunctionId functionId,
          ByteCodeCache *byteCodeCache,byte *serializedFunction,Utf8SourceInfo *sourceInfo,
          ScriptContext *scriptContext,uint functionNumber,char16 *displayName,
          uint displayNameLength,uint displayShortNameOffset,NativeModule *nativeModule,
          Attributes attributes)

{
  Recycler *pRVar1;
  FunctionInfo *this_00;
  ProxyEntryPointInfo *this_01;
  TrackAllocData local_98;
  code *local_70;
  undefined8 local_68;
  TrackAllocData local_60;
  nullptr_t local_38;
  Utf8SourceInfo *local_30;
  Utf8SourceInfo *sourceInfo_local;
  byte *serializedFunction_local;
  ByteCodeCache *byteCodeCache_local;
  LocalFunctionId functionId_local;
  int nestedCount_local;
  DeferDeserializeFunctionInfo *this_local;
  
  local_30 = sourceInfo;
  sourceInfo_local = (Utf8SourceInfo *)serializedFunction;
  serializedFunction_local = (byte *)byteCodeCache;
  byteCodeCache_local._0_4_ = functionId;
  byteCodeCache_local._4_4_ = nestedCount;
  _functionId_local = this;
  FunctionProxy::FunctionProxy(&this->super_FunctionProxy,scriptContext,sourceInfo,functionNumber);
  (this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
  _vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01de0600;
  Memory::WriteBarrierPtr<const_unsigned_char>::WriteBarrierPtr
            (&this->m_functionBytes,(uchar *)sourceInfo_local);
  Memory::WriteBarrierPtr<Js::ByteCodeCache>::WriteBarrierPtr
            (&this->m_cache,(ByteCodeCache *)serializedFunction_local);
  local_38 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<const_char16_t>::WriteBarrierPtr(&this->m_displayName,&local_38);
  this->m_displayNameLength = 0;
  Memory::WriteBarrierPtr<Js::NativeModule>::WriteBarrierPtr(&this->m_nativeModule,nativeModule);
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,(type_info *)&FunctionInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x63e);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_60);
  local_70 = Memory::Recycler::AllocInlined;
  local_68 = 0;
  this_00 = (FunctionInfo *)new<Memory::Recycler>(0x20,pRVar1,0x43c4b0);
  FunctionInfo::FunctionInfo
            (this_00,JavascriptFunction::DeferredDeserializeThunk,attributes | DeferredDeserialize,
             (LocalFunctionId)byteCodeCache_local,&this->super_FunctionProxy);
  Memory::WriteBarrierPtr<Js::FunctionInfo>::operator=
            (&(this->super_FunctionProxy).functionInfo,this_00);
  pRVar1 = ScriptContext::GetRecycler(scriptContext);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_98,(type_info *)&ProxyEntryPointInfo::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x63f);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_98);
  this_01 = (ProxyEntryPointInfo *)new<Memory::Recycler>(0x18,pRVar1,0x43c4b0);
  ProxyEntryPointInfo::ProxyEntryPointInfo
            (this_01,JavascriptFunction::DeferredDeserializeThunk,(ThreadContext *)0x0);
  Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator=
            (&(this->super_FunctionProxy).m_defaultEntryPointInfo,this_01);
  (*(this->super_FunctionProxy).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[6])
            (this,displayName,(ulong)displayNameLength,(ulong)displayShortNameOffset,1);
  return;
}

Assistant:

DeferDeserializeFunctionInfo::DeferDeserializeFunctionInfo(int nestedCount, LocalFunctionId functionId, ByteCodeCache* byteCodeCache, const byte* serializedFunction, Utf8SourceInfo* sourceInfo, ScriptContext* scriptContext, uint functionNumber, const char16* displayName, uint displayNameLength, uint displayShortNameOffset, NativeModule *nativeModule, FunctionInfo::Attributes attributes) :
        FunctionProxy(scriptContext, sourceInfo, functionNumber),
        m_cache(byteCodeCache),
        m_functionBytes(serializedFunction),
        m_displayName(nullptr),
        m_displayNameLength(0),
        m_nativeModule(nativeModule)
    {
        this->functionInfo = RecyclerNew(scriptContext->GetRecycler(), FunctionInfo, DefaultDeferredDeserializeThunk, (FunctionInfo::Attributes)(attributes | FunctionInfo::Attributes::DeferredDeserialize), functionId, this);
        this->m_defaultEntryPointInfo = RecyclerNew(scriptContext->GetRecycler(), ProxyEntryPointInfo, DefaultDeferredDeserializeThunk);
        PERF_COUNTER_INC(Code, DeferDeserializeFunctionProxy);

        SetDisplayName(displayName, displayNameLength, displayShortNameOffset, FunctionProxy::SetDisplayNameFlagsDontCopy);
    }